

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  TRef *pTVar1;
  uint32_t uVar2;
  CTState *cts;
  IRRef1 IVar3;
  CTypeID CVar4;
  TRef TVar6;
  ulong uVar7;
  CType *d;
  ulong uVar8;
  uint k;
  TRef TVar5;
  
  if (*J->base != 0) {
    cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
    k = 0;
    uVar7 = 0;
    uVar8 = 1;
    do {
      CVar4 = crec_bit64_type(cts,(cTValue *)rd->argv[uVar7]);
      if (CVar4 < k) {
        CVar4 = k;
      }
      k = CVar4;
      pTVar1 = J->base + uVar8;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (*pTVar1 != 0);
    if (k != 0) {
      d = cts->tab + k;
      uVar2 = rd->data;
      TVar5 = crec_ct_tv(J,d,0,*J->base,rd->argv);
      IVar3 = (IRRef1)TVar5;
      TVar6 = J->base[1];
      if (TVar6 != 0) {
        uVar7 = 1;
        uVar8 = 2;
        do {
          TVar6 = crec_ct_tv(J,d,0,TVar6,rd->argv + uVar7);
          (J->fold).ins.field_0.ot = (short)k + 10U | (ushort)(uVar2 << 8);
          (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
          TVar5 = lj_opt_fold(J);
          IVar3 = (IRRef1)TVar5;
          TVar6 = J->base[uVar8];
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (TVar6 != 0);
      }
      TVar6 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x548a;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = IVar3;
      TVar6 = lj_opt_fold(J);
      *J->base = TVar6;
      return 1;
    }
  }
  return 0;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_ct_tv(J, ct, 0, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_ct_tv(J, ct, 0, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}